

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileCheckpointReader::LoadFromStorage(SingleFileCheckpointReader *this)

{
  CatalogTransaction transaction_00;
  int iVar1;
  int iVar2;
  type pBVar3;
  MetadataManager *this_00;
  undefined4 extraout_var;
  BufferManager *pBVar4;
  DatabaseInstance *db;
  MetaBlockPointer pointer;
  CatalogTransaction transaction;
  MetadataReader reader;
  CatalogTransaction local_b8;
  MetadataReader local_90;
  
  pBVar3 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
           operator*(&this->storage->block_manager);
  this_00 = GetMetadataManager(this);
  iVar1 = (*pBVar3->_vptr_BlockManager[0xb])(pBVar3);
  if (CONCAT44(extraout_var,iVar1) != 0xffffffffffffffff) {
    iVar2 = (*pBVar3->_vptr_BlockManager[0x12])(pBVar3);
    if ((char)iVar2 != '\0') {
      MetadataManager::GetBlocks
                ((vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_true> *)&local_90,this_00);
      pBVar4 = BufferManager::GetBufferManager(((this->storage->super_StorageManager).db)->db);
      (*pBVar4->_vptr_BufferManager[8])(pBVar4,&local_90);
      ::std::
      vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
      ::~vector((vector<duckdb::shared_ptr<duckdb::BlockHandle,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>
                 *)&local_90);
    }
    pointer.offset = 0;
    pointer.unused_padding = 0;
    pointer.block_pointer = CONCAT44(extraout_var,iVar1);
    MetadataReader::MetadataReader
              (&local_90,this_00,pointer,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
               EXISTING_BLOCKS);
    db = Catalog::GetDatabase((this->super_CheckpointReader).catalog);
    CatalogTransaction::GetSystemTransaction(&local_b8,db);
    transaction_00.context.ptr = local_b8.context.ptr;
    transaction_00.db.ptr = local_b8.db.ptr;
    transaction_00.transaction.ptr = local_b8.transaction.ptr;
    transaction_00.transaction_id = local_b8.transaction_id;
    transaction_00.start_time = local_b8.start_time;
    CheckpointReader::LoadCheckpoint(&this->super_CheckpointReader,transaction_00,&local_90);
    MetadataReader::~MetadataReader(&local_90);
  }
  return;
}

Assistant:

void SingleFileCheckpointReader::LoadFromStorage() {
	auto &block_manager = *storage.block_manager;
	auto &metadata_manager = GetMetadataManager();
	MetaBlockPointer meta_block(block_manager.GetMetaBlock(), 0);
	if (!meta_block.IsValid()) {
		// storage is empty
		return;
	}

	if (block_manager.IsRemote()) {
		auto metadata_blocks = metadata_manager.GetBlocks();
		auto &buffer_manager = BufferManager::GetBufferManager(storage.GetDatabase());
		buffer_manager.Prefetch(metadata_blocks);
	}

	// create the MetadataReader to read from the storage
	MetadataReader reader(metadata_manager, meta_block);
	auto transaction = CatalogTransaction::GetSystemTransaction(catalog.GetDatabase());
	LoadCheckpoint(transaction, reader);
}